

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int handle_subfields(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset)

{
  int iVar1;
  long in_RCX;
  long in_RSI;
  int ret;
  size_t subfield_offset;
  int i;
  FMTypeDesc *in_stack_000000d0;
  size_t in_stack_000000d8;
  size_t in_stack_000000e0;
  estate in_stack_000000e8;
  FMFormat_conflict in_stack_000000f0;
  FFSBuffer in_stack_000000f8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  
  if (*(int *)(in_RSI + 0x48) != 0) {
    for (local_2c = 0; local_2c < *(int *)(in_RSI + 0x44); local_2c = local_2c + 1) {
      iVar1 = field_is_flat((FMFormat_conflict)
                            (in_RCX + *(int *)(*(long *)(in_RSI + 0x78) + (long)local_2c * 0x18 +
                                              0x14)),
                            (FMTypeDesc *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (iVar1 == 0) {
        iVar1 = handle_subfield(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                                in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        if (iVar1 != 1) {
          return 0;
        }
        in_stack_ffffffffffffffc4 = 1;
      }
    }
  }
  return 1;
}

Assistant:

static int
handle_subfields(FFSBuffer buf, FMFormat f, estate s, size_t data_offset)
{
    int i;
    /* if base is not variant (I.E. doesn't contain addresses), return;*/
    if (!f->variant) return 1;

    for (i = 0; i < f->field_count; i++) {
	size_t subfield_offset = data_offset + f->field_list[i].field_offset;
	int ret;
	if (field_is_flat(f, &f->var_list[i].type_desc)) continue;
	ret = handle_subfield(buf, f, s, subfield_offset, data_offset, 
			      &f->var_list[i].type_desc);
	if (ret != 1) return 0;
    }
    return 1;
}